

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

size_t UA_readNumber(UA_Byte *buf,size_t buflen,UA_UInt32 *number)

{
  ulong uVar1;
  UA_UInt32 UVar2;
  UA_UInt32 UVar3;
  ulong uVar4;
  bool bVar5;
  
  if (buf == (UA_Byte *)0x0) {
    buflen = 0;
  }
  else {
    uVar1 = 0;
    UVar2 = 0;
    do {
      UVar3 = UVar2;
      uVar4 = uVar1;
      if (buflen <= uVar4) goto LAB_00114234;
      bVar5 = (byte)(buf[uVar4] - 0x30) < 10;
      uVar1 = uVar4 + 1;
      UVar2 = ((uint)buf[uVar4] + UVar3 * 10) - 0x30;
    } while (bVar5);
    buflen = uVar4 + bVar5;
LAB_00114234:
    *number = UVar3;
  }
  return buflen;
}

Assistant:

size_t UA_readNumber(UA_Byte *buf, size_t buflen, UA_UInt32 *number) {
    if (!buf)
        return 0;
    UA_UInt32 n = 0;
    size_t progress = 0;
    /* read numbers until the end or a non-number character appears */
    while(progress < buflen) {
        UA_Byte c = buf[progress];
        if('0' > c || '9' < c)
            break;
        n = (n*10) + (UA_UInt32)(c-'0');
        ++progress;
    }
    *number = n;
    return progress;
}